

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int32_t __thiscall icu_63::UnicodeSet::indexOf(UnicodeSet *this,UChar32 c)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar3 = -1;
  if ((uint)c < 0x110000) {
    iVar5 = 0;
    iVar6 = 0;
    do {
      iVar7 = iVar6 + 1;
      iVar1 = this->list[iVar6];
      if (c < iVar1) {
        iVar3 = -1;
        bVar2 = false;
        iVar6 = iVar7;
      }
      else {
        iVar6 = iVar6 + 2;
        iVar7 = this->list[iVar7];
        iVar4 = iVar7 - iVar1;
        if (c < iVar7) {
          iVar4 = 0;
          iVar3 = (iVar5 + c) - iVar1;
        }
        bVar2 = iVar7 <= c;
        iVar5 = iVar4 + iVar5;
      }
    } while (bVar2);
  }
  return iVar3;
}

Assistant:

int32_t UnicodeSet::indexOf(UChar32 c) const {
    if (c < MIN_VALUE || c > MAX_VALUE) {
        return -1;
    }
    int32_t i = 0;
    int32_t n = 0;
    for (;;) {
        UChar32 start = list[i++];
        if (c < start) {
            return -1;
        }
        UChar32 limit = list[i++];
        if (c < limit) {
            return n + c - start;
        }
        n += limit - start;
    }
}